

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio_utils.hpp
# Opt level: O1

void setsc<double>(string *entry,double *output)

{
  istream *piVar1;
  FILEIO_Exception *this;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  stringstream local_238 [8];
  stringstream ss;
  ios_base local_1b8 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  std::__cxx11::stringstream::stringstream(local_238,(string *)entry,_S_out|_S_in);
  piVar1 = std::istream::_M_extract<double>((double *)local_238);
  if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    std::__cxx11::stringstream::~stringstream(local_238);
    std::ios_base::~ios_base(local_1b8);
    return;
  }
  this = (FILEIO_Exception *)__cxa_allocate_exception(0x28);
  std::operator+(&local_b0,"Error parsing string \'",entry);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_70 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_70 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_90 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_90 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_50._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_50._M_dataplus._M_p == psVar4) {
    local_50.field_2._M_allocated_capacity = *psVar4;
    local_50.field_2._8_8_ = plVar2[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar4;
  }
  local_50._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  FILEIO_Exception::FILEIO_Exception(this,&local_50);
  __cxa_throw(this,&FILEIO_Exception::typeinfo,General_Exception::~General_Exception);
}

Assistant:

void setsc(const string& entry, T& output) {
  stringstream ss(entry);
  if(!(ss >> output)) {
    throw(FILEIO_Exception("Error parsing string '" + entry + "' into type '" + typeid(T).name() + "'"));
  }
}